

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cxx17_string_view.cpp
# Opt level: O1

void __thiscall
iu_StringViewSplit_x_iutest_x_SplitBySingeChar_Test<char>::Body
          (iu_StringViewSplit_x_iutest_x_SplitBySingeChar_Test<char> *this)

{
  char *in_R9;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  re1_2;
  AssertionResult iutest_ar;
  basic_string_view<char,_std::char_traits<char>_> re1_1 [3];
  basic_string_view<char,_std::char_traits<char>_> s1;
  allocator<char> local_269;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_268;
  string local_250;
  undefined1 *local_230;
  undefined8 local_228;
  undefined1 local_220;
  undefined7 uStack_21f;
  undefined1 local_210;
  AssertionHelper local_208;
  basic_string_view<char,_std::char_traits<char>_> local_1d8;
  undefined8 local_1c8;
  char *pcStack_1c0;
  undefined8 local_1b8;
  char *pcStack_1b0;
  basic_string_view<char,_std::char_traits<char>_> local_1a8;
  undefined1 local_198 [392];
  
  local_1a8._M_len = 0x13;
  local_1a8._M_str = "arikitari na world!";
  local_1b8 = 6;
  pcStack_1b0 = "world!";
  local_1c8 = 2;
  pcStack_1c0 = "na";
  local_1d8._M_len = 9;
  local_1d8._M_str = "arikitari";
  local_198[0] = ' ';
  ::detail::operator|<std::basic_string_view<char,_std::char_traits<char>_>,_char,_nullptr>
            (&local_268,&local_1a8,(split_helper<char,_true,_false,_false> *)local_198);
  if ((long)local_268.
            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_268.
            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x30) {
    local_210 = std::__equal<false>::
                equal<std::basic_string_view<char,std::char_traits<char>>const*,std::basic_string_view<char,std::char_traits<char>>const*>
                          (&local_1d8,&local_1a8,
                           local_268.
                           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
  }
  else {
    local_210 = false;
  }
  local_228 = 0;
  local_220 = 0;
  local_230 = &local_220;
  if ((bool)local_210 == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_250,(internal *)&local_230,
               (AssertionResult *)
               "std::equal(std::begin(re1_1), std::end(re1_1), re1_2.begin(), re1_2.end())","false",
               "true",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,local_250._M_dataplus._M_p,&local_269);
    local_208.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_cxx17_string_view.cpp"
    ;
    local_208.m_part_result.super_iuCodeMessage.m_line = 0x112;
    local_208.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_208.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_208.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,CONCAT71(uStack_21f,local_220) + 1);
  }
  if (local_268.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (basic_string_view<char,_std::char_traits<char>_> *)0x0) {
    operator_delete(local_268.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_268.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_268.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

IUTEST_TYPED_TEST(StringViewSplit, SplitBySingeChar)
{
	using char_type = TypeParam;
	const std::basic_string_view<char_type> s1 = constant::arikitari_na_world<char_type>();
	const std::basic_string_view<char_type> re1_1[] = { constant::arikitari<char_type>(), constant::na<char_type>(), constant::world<char_type>() };
	const auto re1_2 = s1 | split(constant::space<char_type>());
	IUTEST_ASSERT_TRUE(std::equal(std::begin(re1_1), std::end(re1_1), re1_2.begin(), re1_2.end()));
	if constexpr(!std::is_same_v<char_type, char>) {
		const std::basic_string_view<char_type> s2 = constant::arikitarina_sekai<char_type>();
		const std::basic_string_view<char_type> re2_1[] = { constant::arikitarina<char_type>(), constant::sekai<char_type>() };
		const auto re2_2 = s2 | split(constant::space<char_type>());
		IUTEST_ASSERT_TRUE(std::equal(std::begin(re2_1), std::end(re2_1), re2_2.begin(), re2_2.end()));
	}
}